

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void vera::splitFacesFromHorizontalCross<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  CubemapFace<float> *pCVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int i;
  long lVar8;
  ulong uVar9;
  
  iVar5 = (int)(_width >> 2);
  iVar7 = (int)(_height / 3);
  uVar3 = (long)iVar7 * (long)iVar5 * _channels;
  lVar8 = 0;
  do {
    pCVar1 = (CubemapFace<float> *)operator_new(0x18);
    pCVar1->id = 0;
    pCVar1->width = 0;
    pCVar1->height = 0;
    pCVar1->currentOffset = 0;
    pCVar1->data = (float *)0x0;
    _faces[lVar8] = pCVar1;
    pCVar1->id = (int)lVar8;
    pfVar2 = (float *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    pCVar1->data = pfVar2;
    pCVar1->width = iVar5;
    pCVar1->height = iVar7;
    pCVar1->currentOffset = 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  if (_height != 0) {
    uVar3 = 0;
    do {
      uVar9 = 0;
      lVar8 = 2;
      do {
        iVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                     (long)iVar7);
        lVar6 = lVar8 + -1;
        if (lVar8 == 0 && iVar4 == 1) {
          pCVar1 = *_faces;
        }
        else {
          pCVar1 = (CubemapFace<float> *)0x0;
        }
        if (lVar8 == 2 && iVar4 == 1) {
          pCVar1 = _faces[1];
        }
        if (lVar8 == 1 && iVar4 == 0) {
          pCVar1 = _faces[2];
        }
        if (iVar4 == 2 && lVar8 == 1) {
          pCVar1 = _faces[3];
        }
        if (iVar4 == 1 && lVar8 == 1) {
          pCVar1 = _faces[4];
        }
        if (lVar8 == -1 && iVar4 == 1) {
          pCVar1 = _faces[5];
        }
        if (pCVar1 != (CubemapFace<float> *)0x0) {
          memcpy(pCVar1->data + pCVar1->currentOffset,
                 (void *)(((long)(((uVar9 & 0xffffffff) + uVar3 * _width) * (_channels << 0x20)) >>
                          0x1e) + (long)_data),
                 (long)((ulong)((uint)_width & 0xfffffffc) * (_channels << 0x20)) >> 0x20);
          pCVar1->currentOffset = pCVar1->currentOffset + (int)_channels * iVar5;
        }
        uVar9 = uVar9 + (_width >> 2);
        lVar8 = lVar6;
      } while (lVar6 != -2);
      uVar3 = uVar3 + 1;
    } while (uVar3 != _height);
  }
  return;
}

Assistant:

void splitFacesFromHorizontalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 4;
    int faceHeight = _height / 3;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[_channels * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 4; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = _channels * (faceWidth * iFace + l * _width);

            //      0   1   2   3 i      
            //  2      -X 
            //  1  -Y  +Z  +Y  -Z     
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 3 && jFace == 1) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * _channels;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (_channels * faceWidth);
            }
        }
    }
}